

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

locale booster::locale::impl_std::create_parsing
                 (locale *in,string *locale_name,character_facet_type type,utf8_support utf)

{
  locale *plVar1;
  char *pcVar2;
  ulong uVar3;
  locale *this;
  base_num_parse<char> *__f;
  base_num_parse<wchar_t> *this_00;
  int in_ECX;
  locale *in_RSI;
  _Impl *in_RDI;
  int in_R8D;
  size_t in_stack_00000060;
  locale *in_stack_00000068;
  utf8_moneypunct_from_wide<false> *in_stack_00000070;
  locale tmp_2;
  locale base_1;
  locale tmp_1;
  locale tmp;
  locale base;
  locale *tmp_3;
  size_t in_stack_fffffffffffffe28;
  base_num_parse<char> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  utf8_moneypunct<false> *in_stack_fffffffffffffe40;
  utf8_moneypunct_from_wide<false> *in_stack_fffffffffffffe50;
  locale *in_stack_fffffffffffffe58;
  locale *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffea0;
  locale *in_stack_fffffffffffffea8;
  locale local_c0;
  undefined1 local_b1;
  locale local_b0;
  undefined1 local_a1;
  locale local_a0;
  locale local_98;
  locale local_90;
  locale local_88;
  locale local_80;
  locale local_78;
  locale local_70;
  locale local_68;
  locale local_60;
  locale local_58;
  locale local_50;
  locale local_48 [3];
  locale in_stack_ffffffffffffffd0;
  locale in_stack_ffffffffffffffd8;
  
  if (in_ECX == 1) {
    if (in_R8D == 3) {
      plVar1 = (locale *)std::locale::classic();
      std::locale::locale((locale *)&stack0xffffffffffffffd8,plVar1);
      pcVar2 = (char *)operator_new(0x18);
      uVar3 = std::__cxx11::string::c_str();
      std::__cxx11::numpunct_byname<wchar_t>::numpunct_byname(pcVar2,uVar3);
      std::locale::locale<std::__cxx11::numpunct_byname<wchar_t>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (numpunct_byname<wchar_t> *)in_stack_fffffffffffffe50);
      std::locale::operator=((locale *)&stack0xffffffffffffffd8,(locale *)&stack0xffffffffffffffd0);
      std::locale::~locale((locale *)&stack0xffffffffffffffd0);
      pcVar2 = (char *)operator_new(0x18);
      uVar3 = std::__cxx11::string::c_str();
      std::__cxx11::moneypunct_byname<wchar_t,true>::moneypunct_byname(pcVar2,uVar3);
      std::locale::locale<std::__cxx11::moneypunct_byname<wchar_t,true>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (moneypunct_byname<wchar_t,_true> *)in_stack_fffffffffffffe50);
      std::locale::operator=((locale *)&stack0xffffffffffffffd8,local_48);
      std::locale::~locale(local_48);
      pcVar2 = (char *)operator_new(0x18);
      uVar3 = std::__cxx11::string::c_str();
      std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname(pcVar2,uVar3);
      std::locale::locale<std::__cxx11::moneypunct_byname<wchar_t,false>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (moneypunct_byname<wchar_t,_false> *)in_stack_fffffffffffffe50);
      std::locale::operator=((locale *)&stack0xffffffffffffffd8,&local_50);
      std::locale::~locale(&local_50);
      operator_new(0x80);
      utf8_numpunct_from_wide::utf8_numpunct_from_wide
                ((utf8_numpunct_from_wide *)CONCAT44(in_ECX,in_R8D),
                 (locale *)in_stack_ffffffffffffffd8._M_impl,
                 (size_t)in_stack_ffffffffffffffd0._M_impl);
      std::locale::locale<booster::locale::impl_std::utf8_numpunct_from_wide>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (utf8_numpunct_from_wide *)in_stack_fffffffffffffe50);
      operator_new(0xb0);
      utf8_moneypunct_from_wide<true>::utf8_moneypunct_from_wide
                ((utf8_moneypunct_from_wide<true> *)in_stack_00000070,in_stack_00000068,
                 in_stack_00000060);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<true>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (utf8_moneypunct_from_wide<true> *)in_stack_fffffffffffffe50);
      std::locale::operator=(&local_58,&local_60);
      std::locale::~locale(&local_60);
      operator_new(0xb0);
      utf8_moneypunct_from_wide<false>::utf8_moneypunct_from_wide
                (in_stack_00000070,in_stack_00000068,in_stack_00000060);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<false>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      std::locale::operator=(&local_58,&local_68);
      std::locale::~locale(&local_68);
      operator_new(0x10);
      util::base_num_parse<char>::base_num_parse
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      std::locale::locale<booster::locale::util::base_num_parse<char>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (base_num_parse<char> *)in_stack_fffffffffffffe50);
      std::locale::~locale(&local_58);
      std::locale::~locale((locale *)&stack0xffffffffffffffd8);
    }
    else if (in_R8D == 1) {
      operator_new(0x18);
      std::__cxx11::string::c_str();
      utf8_numpunct::utf8_numpunct
                ((utf8_numpunct *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (size_t)in_stack_fffffffffffffe30);
      std::locale::locale<booster::locale::impl_std::utf8_numpunct>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (utf8_numpunct *)in_stack_fffffffffffffe50);
      operator_new(0x18);
      std::__cxx11::string::c_str();
      utf8_moneypunct<true>::utf8_moneypunct
                ((utf8_moneypunct<true> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (size_t)in_stack_fffffffffffffe30);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct<true>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (utf8_moneypunct<true> *)in_stack_fffffffffffffe50);
      std::locale::operator=(&local_70,&local_78);
      std::locale::~locale(&local_78);
      operator_new(0x18);
      std::__cxx11::string::c_str();
      utf8_moneypunct<false>::utf8_moneypunct
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (size_t)in_stack_fffffffffffffe30);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct<false>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (utf8_moneypunct<false> *)in_stack_fffffffffffffe50);
      std::locale::operator=(&local_70,&local_80);
      std::locale::~locale(&local_80);
      operator_new(0x10);
      util::base_num_parse<char>::base_num_parse
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      std::locale::locale<booster::locale::util::base_num_parse<char>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (base_num_parse<char> *)in_stack_fffffffffffffe50);
      std::locale::~locale(&local_70);
    }
    else if (in_R8D == 2) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::locale::locale(&local_88,pcVar2);
      operator_new(0x80);
      utf8_numpunct_from_wide::utf8_numpunct_from_wide
                ((utf8_numpunct_from_wide *)CONCAT44(in_ECX,in_R8D),
                 (locale *)in_stack_ffffffffffffffd8._M_impl,
                 (size_t)in_stack_ffffffffffffffd0._M_impl);
      std::locale::locale<booster::locale::impl_std::utf8_numpunct_from_wide>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (utf8_numpunct_from_wide *)in_stack_fffffffffffffe50);
      operator_new(0xb0);
      utf8_moneypunct_from_wide<true>::utf8_moneypunct_from_wide
                ((utf8_moneypunct_from_wide<true> *)in_stack_00000070,in_stack_00000068,
                 in_stack_00000060);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<true>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (utf8_moneypunct_from_wide<true> *)in_stack_fffffffffffffe50);
      plVar1 = &local_98;
      std::locale::operator=(&local_90,plVar1);
      std::locale::~locale(plVar1);
      this = (locale *)operator_new(0xb0);
      utf8_moneypunct_from_wide<false>::utf8_moneypunct_from_wide
                (in_stack_00000070,in_stack_00000068,in_stack_00000060);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<false>>
                (this,plVar1,in_stack_fffffffffffffe50);
      std::locale::operator=(&local_90,&local_a0);
      std::locale::~locale(&local_a0);
      __f = (base_num_parse<char> *)operator_new(0x10);
      util::base_num_parse<char>::base_num_parse
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      std::locale::locale<booster::locale::util::base_num_parse<char>>(this,plVar1,__f);
      std::locale::~locale(&local_90);
      std::locale::~locale(&local_88);
    }
    else {
      local_a1 = 0;
      create_basic_parsing<char>(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      operator_new(0x10);
      util::base_num_parse<char>::base_num_parse
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      std::locale::locale<booster::locale::util::base_num_parse<char>>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (base_num_parse<char> *)in_stack_fffffffffffffe50);
      std::locale::operator=((locale *)in_RDI,&local_b0);
      std::locale::~locale(&local_b0);
    }
  }
  else if (in_ECX == 2) {
    local_b1 = 0;
    create_basic_parsing<wchar_t>(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    this_00 = (base_num_parse<wchar_t> *)operator_new(0x10);
    util::base_num_parse<wchar_t>::base_num_parse(this_00,(size_t)in_RSI);
    std::locale::locale<booster::locale::util::base_num_parse<wchar_t>>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (base_num_parse<wchar_t> *)in_stack_fffffffffffffe50);
    std::locale::operator=((locale *)in_RDI,&local_c0);
    std::locale::~locale(&local_c0);
  }
  else {
    std::locale::locale((locale *)in_RDI,in_RSI);
  }
  return (locale)in_RDI;
}

Assistant:

std::locale create_parsing( std::locale const &in,
                            std::string const &locale_name,
                            character_facet_type type,
                            utf8_support utf)
{
        switch(type) {
        case char_facet:
            {
                if(utf == utf8_from_wide ) {
                    std::locale base = std::locale::classic();
                    
                    base = std::locale(base,new std::numpunct_byname<wchar_t>(locale_name.c_str()));
                    base = std::locale(base,new std::moneypunct_byname<wchar_t,true>(locale_name.c_str()));
                    base = std::locale(base,new std::moneypunct_byname<wchar_t,false>(locale_name.c_str()));

                    std::locale tmp = std::locale(in,new utf8_numpunct_from_wide(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<true>(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<false>(base));
                    return std::locale(tmp,new util::base_num_parse<char>());
                }
                else if(utf == utf8_native) {
                    std::locale tmp = std::locale(in,new utf8_numpunct(locale_name.c_str()));
                    tmp = std::locale(tmp,new utf8_moneypunct<true>(locale_name.c_str()));
                    tmp = std::locale(tmp,new utf8_moneypunct<false>(locale_name.c_str()));
                    return std::locale(tmp,new util::base_num_parse<char>());
                }
                else if(utf == utf8_native_with_wide) {
                    std::locale base = std::locale(locale_name.c_str());

                    std::locale tmp = std::locale(in,new utf8_numpunct_from_wide(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<true>(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<false>(base));
                    return std::locale(tmp,new util::base_num_parse<char>());
                }
                else 
                {
                    std::locale tmp = create_basic_parsing<char>(in,locale_name);
                    tmp = std::locale(in,new util::base_num_parse<char>());
                    return tmp;
                }
            }
        case wchar_t_facet:
                {
                    std::locale tmp = create_basic_parsing<wchar_t>(in,locale_name);
                    tmp = std::locale(in,new util::base_num_parse<wchar_t>());
                    return tmp;
                }
        #ifdef BOOSTER_HAS_CHAR16_T
        case char16_t_facet:
                {
                    std::locale tmp = create_basic_parsing<char16_t>(in,locale_name);
                    tmp = std::locale(in,new util::base_num_parse<char16_t>());
                    return tmp;
                }
        #endif
        #ifdef BOOSTER_HAS_CHAR32_T
        case char32_t_facet:
                {
                    std::locale tmp = create_basic_parsing<char32_t>(in,locale_name);
                    tmp = std::locale(in,new util::base_num_parse<char32_t>());
                    return tmp;
                }
        #endif
        default:
            return in;
        }
}